

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

char * leveldb::EncodeVarint32(char *dst,uint32_t v)

{
  byte bVar1;
  uchar *ptr;
  
  bVar1 = (byte)v;
  if (v < 0x80) {
    *dst = bVar1;
    return dst + 1;
  }
  if (v < 0x4000) {
    *dst = bVar1 | 0x80;
    dst[1] = (char)(v >> 7);
    return dst + 2;
  }
  if (v < 0x200000) {
    *dst = bVar1 | 0x80;
    dst[1] = (byte)(v >> 7) | 0x80;
    dst[2] = (char)(v >> 0xe);
    return dst + 3;
  }
  *dst = bVar1 | 0x80;
  dst[1] = (byte)(v >> 7) | 0x80;
  dst[2] = (byte)(v >> 0xe) | 0x80;
  bVar1 = (byte)(v >> 0x15);
  if (v < 0x10000000) {
    dst[3] = bVar1;
    return dst + 4;
  }
  dst[3] = bVar1 | 0x80;
  dst[4] = (byte)(v >> 0x1c);
  return dst + 5;
}

Assistant:

char* EncodeVarint32(char* dst, uint32_t v) {
  // Operate on characters as unsigneds
  unsigned char* ptr = reinterpret_cast<unsigned char*>(dst);
  static const int B = 128;
  if (v < (1 << 7)) {
    *(ptr++) = v;
  } else if (v < (1 << 14)) {
    *(ptr++) = v | B;
    *(ptr++) = v >> 7;
  } else if (v < (1 << 21)) {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = v >> 14;
  } else if (v < (1 << 28)) {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = (v >> 14) | B;
    *(ptr++) = v >> 21;
  } else {
    *(ptr++) = v | B;
    *(ptr++) = (v >> 7) | B;
    *(ptr++) = (v >> 14) | B;
    *(ptr++) = (v >> 21) | B;
    *(ptr++) = v >> 28;
  }
  return reinterpret_cast<char*>(ptr);
}